

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O0

void __thiscall kj::_::Once::runOnce(Once *this,Event **init)

{
  UnwindDetector *this_00;
  bool bVar1;
  uint uVar2;
  Type *func;
  ulong in_stack_fffffffffffffef8;
  Fault local_c0;
  Fault f;
  uint *local_b0;
  undefined1 local_a8 [8];
  DebugComparison<unsigned_int_&,_kj::_::Once::State> _kjCondition;
  Type local_72;
  undefined1 local_71 [4];
  BlockedOnReason local_6d;
  undefined1 auStack_6c [3];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_c__:537:5)>
  _kjDefer537;
  BlockedOnReason blockReason;
  undefined1 local_58 [24];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_c__:519:7)>
  _kjDefer526;
  UnwindDetector _kjUnwindDetector526;
  uint local_24;
  Event **ppEStack_20;
  uint state;
  Initializer *init_local;
  Once *this_local;
  
  ppEStack_20 = init;
  init_local = (Initializer *)this;
  do {
    local_24 = 0;
    LOCK();
    uVar2 = *(uint *)this;
    _kjDefer526.maybeFunc.ptr.field_1._15_1_ = uVar2 == 0;
    if ((bool)_kjDefer526.maybeFunc.ptr.field_1._15_1_) {
      *(undefined4 *)this = 1;
      uVar2 = 0;
    }
    UNLOCK();
    if ((bool)_kjDefer526.maybeFunc.ptr.field_1._15_1_) {
      this_00 = (UnwindDetector *)((long)&_kjDefer526.maybeFunc.ptr.field_1 + 8);
      UnwindDetector::UnwindDetector(this_00);
      local_58._0_8_ = this_00;
      local_58._8_8_ = this;
      defer<kj::_::Once::runOnce(kj::_::Once::Initializer&,kj::NoopSourceLocation)::__0>
                ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_c__:519:7)>
                  *)(local_58 + 0x10),(kj *)local_58,func);
      (*(code *)(*ppEStack_20)->_vptr_Event)();
      Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++:519:7)>
      ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_c__:519:7)>
                   *)(local_58 + 0x10));
      stack0xffffffffffffff98 = 3;
      LOCK();
      _auStack_6c = *(int *)this;
      *(undefined4 *)this = 3;
      UNLOCK();
      if (_auStack_6c != 2) {
        return;
      }
      syscall(0xca,this,0x81,0x7fffffff,0,0,in_stack_fffffffffffffef8 & 0xffffffff00000000);
      return;
    }
    local_24 = uVar2;
    BlockedOnOnceInit::BlockedOnOnceInit((BlockedOnOnceInit *)(local_71 + 3),this);
    BlockedOnReason::BlockedOnReason(&local_6d,(BlockedOnOnceInit *)(local_71 + 3));
    defer<kj::_::Once::runOnce(kj::_::Once::Initializer&,kj::NoopSourceLocation)::__1>
              ((kj *)local_71,&local_72);
    uVar2 = local_24;
LAB_008563f1:
    do {
      local_24 = uVar2;
      if (local_24 == 3) {
        bVar1 = false;
        goto LAB_008565ac;
      }
      if (local_24 == 1) {
        LOCK();
        uVar2 = *(uint *)this;
        _kjCondition._39_1_ = uVar2 == 1;
        if ((bool)_kjCondition._39_1_) {
          *(undefined4 *)this = 2;
          uVar2 = local_24;
        }
        UNLOCK();
        if (!(bool)_kjCondition._39_1_) goto LAB_008563f1;
      }
      else {
        local_b0 = (uint *)DebugExpressionStart::operator<<
                                     ((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_24);
        f.exception._4_4_ = 2;
        DebugExpression<unsigned_int&>::operator==
                  ((DebugComparison<unsigned_int_&,_kj::_::Once::State> *)local_a8,
                   (DebugExpression<unsigned_int&> *)&local_b0,(State *)((long)&f.exception + 4));
        bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_a8);
        if (!bVar1) {
          Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,kj::_::Once::State>&>
                    (&local_c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++"
                     ,0x226,FAILED,"state == INITIALIZING_WITH_WAITERS","_kjCondition,",
                     (DebugComparison<unsigned_int_&,_kj::_::Once::State> *)local_a8);
          Debug::Fault::fatal(&local_c0);
        }
      }
      setCurrentThreadIsWaitingFor(&local_6d);
      in_stack_fffffffffffffef8 = in_stack_fffffffffffffef8 & 0xffffffff00000000;
      syscall(0xca,this,0x80,2,0,0,in_stack_fffffffffffffef8);
      local_24 = *(uint *)this;
      uVar2 = local_24;
    } while (local_24 != 0);
    bVar1 = true;
LAB_008565ac:
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++:537:5)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_c__:537:5)>
                 *)local_71);
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void Once::runOnce(Initializer& init, LockSourceLocationArg location) {
startOver:
  uint state = UNINITIALIZED;
  if (__atomic_compare_exchange_n(&futex, &state, INITIALIZING, false,
                                  __ATOMIC_RELAXED, __ATOMIC_RELAXED)) {
    // It's our job to initialize!
    {
      KJ_ON_SCOPE_FAILURE({
        // An exception was thrown by the initializer.  We have to revert.
        if (__atomic_exchange_n(&futex, UNINITIALIZED, __ATOMIC_RELEASE) ==
            INITIALIZING_WITH_WAITERS) {
          // Someone was waiting for us to finish.
          syscall(SYS_futex, &futex, FUTEX_WAKE_PRIVATE, INT_MAX, nullptr, nullptr, 0);
        }
      });

      init.run();
    }
    if (__atomic_exchange_n(&futex, INITIALIZED, __ATOMIC_RELEASE) ==
        INITIALIZING_WITH_WAITERS) {
      // Someone was waiting for us to finish.
      syscall(SYS_futex, &futex, FUTEX_WAKE_PRIVATE, INT_MAX, nullptr, nullptr, 0);
    }
  } else {
    BlockedOnReason blockReason = BlockedOnOnceInit{*this, location};
    KJ_DEFER(setCurrentThreadIsNoLongerWaiting());

    for (;;) {
      if (state == INITIALIZED) {
        break;
      } else if (state == INITIALIZING) {
        // Initialization is taking place in another thread.  Indicate that we're waiting.
        if (!__atomic_compare_exchange_n(&futex, &state, INITIALIZING_WITH_WAITERS, true,
                                         __ATOMIC_ACQUIRE, __ATOMIC_ACQUIRE)) {
          // State changed, retry.
          continue;
        }
      } else {
        KJ_DASSERT(state == INITIALIZING_WITH_WAITERS);
      }

      // Wait for initialization.
      setCurrentThreadIsWaitingFor(&blockReason);
      syscall(SYS_futex, &futex, FUTEX_WAIT_PRIVATE, INITIALIZING_WITH_WAITERS,
                         nullptr, nullptr, 0);
      state = __atomic_load_n(&futex, __ATOMIC_ACQUIRE);

      if (state == UNINITIALIZED) {
        // Oh hey, apparently whoever was trying to initialize gave up.  Let's take it from the
        // top.
        goto startOver;
      }
    }
  }
}